

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

sock_address_any * __thiscall
sockpp::socket::address(sock_address_any *__return_storage_ptr__,socket *this)

{
  bool bVar1;
  uint uVar2;
  int ret;
  undefined1 local_b8 [8];
  result<int> res;
  undefined1 local_98 [4];
  socklen_t len;
  sockaddr_storage addrStore;
  socket *this_local;
  
  addrStore.__ss_align = (unsigned_long)this;
  memset(local_98,0,0x80);
  res.err_._M_cat._4_4_ = 0x80;
  uVar2 = getsockname(this->handle_,(sockaddr *)local_98,(socklen_t *)((long)&res.err_._M_cat + 4));
  check_res<int,int>((result<int> *)local_b8,(socket *)(ulong)uVar2,ret);
  bVar1 = sockpp::result::operator_cast_to_bool((result *)local_b8);
  if (bVar1) {
    sock_address_any::sock_address_any
              (__return_storage_ptr__,(sockaddr_storage *)local_98,res.err_._M_cat._4_4_);
  }
  else {
    memset(__return_storage_ptr__,0,0x90);
    sock_address_any::sock_address_any(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

sock_address_any socket::address() const {
    auto addrStore = sockaddr_storage{};
    socklen_t len = sizeof(sockaddr_storage);

    // TODO: Return the result
    auto res =
        check_res(::getsockname(handle_, reinterpret_cast<sockaddr*>(&addrStore), &len));
    if (!res)
        return sock_address_any{};

    return sock_address_any(addrStore, len);
}